

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O0

void __thiscall
adios2::format::BPBase::SerialElementIndex::SerialElementIndex
          (SerialElementIndex *this,uint32_t memberID,size_t bufferSize)

{
  undefined4 in_ESI;
  size_type in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  size_type __n;
  
  __n = in_RDI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xadf501);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x20) = in_ESI;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined1 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  std::vector<char,_std::allocator<char>_>::reserve(unaff_retaddr,__n);
  return;
}

Assistant:

BPBase::SerialElementIndex::SerialElementIndex(const uint32_t memberID, const size_t bufferSize)
: MemberID(memberID)
{
    Buffer.reserve(bufferSize);
}